

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

ssize_t __thiscall QMakeProject::read(QMakeProject *this,int __fd,void *__buf,size_t __nbytes)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  char cVar3;
  VisitReturn VVar4;
  QArrayData *pQVar5;
  undefined4 in_register_00000034;
  QString *pQVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QByteArrayView QVar8;
  QLatin1String QVar9;
  QArrayData *local_88 [3];
  QDir local_70 [8];
  QString local_68;
  QArrayData *local_48;
  char16_t *pcStack_40;
  undefined1 *local_38;
  long local_30;
  
  pQVar6 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QString::operator=(&this->m_projectFile,pQVar6);
  QString::operator=(&(this->super_QMakeEvaluator).m_outputDir,(QString *)&Option::output_dir);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (*(long *)(pQVar6 + 0x10) == 1) {
    QVar7.m_data = *(storage_type_conflict **)(pQVar6 + 8);
    QVar7.m_size = 1;
    QVar9.m_data = "-";
    QVar9.m_size = 1;
    cVar3 = QtPrivate::equalStrings(QVar7,QVar9);
    if (cVar3 != '\0') {
      QVar8.m_data = (storage_type *)0x7;
      QVar8.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar8);
      local_68.d.d = (Data *)local_48;
      local_68.d.ptr = pcStack_40;
      local_68.d.size = (qsizetype)local_38;
      goto LAB_002a163d;
    }
  }
  qmake_getpwd();
  QDir::QDir(local_70,(QString *)local_88);
  QDir::absoluteFilePath((QString *)&local_48);
  QDir::cleanPath((QString *)&local_68);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  QDir::~QDir(local_70);
  if (local_88[0] != (QArrayData *)0x0) {
    LOCK();
    (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88[0],2,0x10);
    }
  }
LAB_002a163d:
  QFileInfo::QFileInfo((QFileInfo *)local_88,(QString *)&local_68);
  QFileInfo::path();
  pQVar5 = &((this->m_projectDir).d.d)->super_QArrayData;
  pcVar1 = (this->m_projectDir).d.ptr;
  (this->m_projectDir).d.d = (Data *)local_48;
  (this->m_projectDir).d.ptr = pcStack_40;
  qVar2 = (this->m_projectDir).d.size;
  (this->m_projectDir).d.size = (qsizetype)local_38;
  local_48 = pQVar5;
  pcStack_40 = pcVar1;
  local_38 = (undefined1 *)qVar2;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)local_88);
  VVar4 = QMakeEvaluator::evaluateFile
                    (&this->super_QMakeEvaluator,&local_68,EvalProjectFile,
                     (QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>)SUB84(__buf,0));
  if (VVar4 == ReturnError) {
    qmakeClearCaches();
    exit(3);
  }
  pQVar5 = &(local_68.d.d)->super_QArrayData;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      pQVar5 = (QArrayData *)QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return CONCAT71((int7)((ulong)pQVar5 >> 8),VVar4 != ReturnFalse);
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeProject::read(const QString &project, LoadFlags what)
{
    m_projectFile = project;
    setOutputDir(Option::output_dir);
    QString absproj = (project == QLatin1String("-"))
            ? QLatin1String("(stdin)")
            : QDir::cleanPath(QDir(qmake_getpwd()).absoluteFilePath(project));
    m_projectDir = QFileInfo(absproj).path();
    return boolRet(evaluateFile(absproj, QMakeHandler::EvalProjectFile, what));
}